

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec2,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *eps2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int rn2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  type_conflict5 tVar4;
  long in_RDI;
  int *in_R9;
  int in_stack_00000008;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000018;
  cpp_dec_float<200U,_int,_void> *in_stack_00000028;
  uint in_stack_00000030;
  long in_stack_00000038;
  int *in_stack_00000040;
  int *in_stack_00000048;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000000a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000002a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000002b0;
  int *in_stack_000002b8;
  int *in_stack_000002c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000002c8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000002d0;
  int *rperm_2;
  int k_2;
  int j_2;
  int i_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_2;
  int *rperm_1;
  int k_1;
  int j_1;
  int i_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_1;
  int *in_stack_00000578;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000580;
  int *it;
  int *rperm;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff648;
  cpp_dec_float<200U,_int,_void> *pcVar5;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff650;
  cpp_dec_float<200U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff748;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff750;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff798;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff7a0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff7a8;
  cpp_dec_float<200U,_int,_void> local_774;
  undefined4 local_6f4;
  undefined1 local_6f0 [128];
  long local_670;
  uint local_668;
  uint local_664;
  int local_660;
  undefined4 local_5dc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffa30;
  int in_stack_fffffffffffffa3c;
  int *in_stack_fffffffffffffa40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffa48;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffa50;
  int local_4cc;
  int local_4c8;
  undefined4 local_444;
  int *local_340;
  long local_338;
  int local_32c;
  int local_328;
  int local_324;
  int in_stack_fffffffffffffddc;
  int *in_stack_fffffffffffffde0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffdf8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe08;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe10;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  this_00 = (cpp_dec_float<200U,_int,_void> *)&stack0x00000030;
  pcVar5 = in_stack_00000028;
  vSolveLright2(in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,
                in_stack_000002b0,in_stack_000002a8,stack0x00000570,in_stack_00000578,
                in_stack_00000580);
  if (in_stack_00000038 == 0) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00);
    lVar2 = *(long *)(in_RDI + 0x298);
    local_4cc = 0;
    for (local_4c8 = 0; local_4c8 < in_stack_00000008; local_4c8 = local_4c8 + 1) {
      iVar1 = in_R9[local_4c8];
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,pcVar5);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
      if (bVar3) {
        enQueueMax(in_R9,&local_4cc,*(int *)(lVar2 + (long)iVar1 * 4));
      }
      else {
        local_5dc = 0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar5);
      }
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00);
    local_340 = in_stack_00000048;
    local_338 = *(long *)(in_RDI + 0x298);
    local_328 = 0;
    for (local_324 = 0; local_324 < in_stack_00000008; local_324 = local_324 + 1) {
      local_32c = in_R9[local_324];
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,pcVar5);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
      if (bVar3) {
        *local_340 = local_32c;
        local_340 = local_340 + 1;
        enQueueMax(in_R9,&local_328,*(int *)(local_338 + (long)local_32c * 4));
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,pcVar5);
      }
      else {
        local_444 = 0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar5);
      }
    }
    *in_stack_00000040 = local_328;
  }
  if ((double)(int)in_stack_00000030 <= (double)*(int *)(in_RDI + 4) * 0.2) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00);
    local_670 = *(long *)(in_RDI + 0x298);
    local_664 = 0;
    for (local_660 = 0; local_660 < (int)in_stack_00000030; local_660 = local_660 + 1) {
      local_668 = (in_stack_00000028->data)._M_elems[local_660];
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,pcVar5);
      local_20 = local_6f0;
      local_28 = in_stack_00000018;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_29,in_stack_00000018);
      local_10 = local_6f0;
      local_18 = local_28;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      local_8 = local_6f0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate(this_00);
      tVar4 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar5,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6e4b1d);
      if (tVar4) {
        enQueueMax((int *)in_stack_00000028,(int *)&local_664,
                   *(int *)(local_670 + (long)(int)local_668 * 4));
      }
      else {
        tVar4 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar5,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6e4b65);
        if (tVar4) {
          enQueueMax((int *)in_stack_00000028,(int *)&local_664,
                     *(int *)(local_670 + (long)(int)local_668 * 4));
        }
        else {
          local_6f4 = 0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    (this_00,(long_long_type)pcVar5);
        }
      }
    }
    in_stack_00000030 = local_664;
  }
  else {
    (in_stack_00000028->data)._M_elems[0] = *(int *)(in_RDI + 4) - 1;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5);
  pcVar5 = &local_774;
  in_stack_00000008 =
       vSolveUright(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                    (int *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                    in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,
                    in_stack_000000a0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5);
  vSolveUrightNoNZ(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_fffffffffffffe00,(int *)in_stack_fffffffffffffdf8,
                   in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8);
  if (*(int *)(in_RDI + 0x2f8) == 0) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    in_stack_00000008 =
         vSolveUpdateRight(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                           in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                           in_stack_fffffffffffffa30);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    vSolveUpdateRightNoNZ
              (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  }
  return in_stack_00000008;
}

Assistant:

int CLUFactor<R>::vSolveRight4update2(R eps,
                                      R* vec, int* idx,                  /* result1 */
                                      R* rhs, int* ridx, int rn,         /* rhs1    */
                                      R* vec2, R eps2,              /* result2 */
                                      R* rhs2, int* ridx2, int rn2,      /* rhs2    */
                                      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
      /* ridx2[1] = thedim - 2; */
   }
   else
   {
      R x;
      /*      R  maxabs; */
      int i, j, k;
      int* rperm;

      /*      maxabs = 1;    */
      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            /*              maxabs = (maxabs < -x) ? -x : maxabs;  */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            /*              maxabs = (maxabs < x) ? x : maxabs;    */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;

      /*      eps2 = maxabs * eps2;  */
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);

   /*
    *  rn = vSolveUright2(vec, idx, rhs, ridx, rn, eps, vec2, rhs2, ridx2, rn2, eps2);
    */

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
   }

   return rn;
}